

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

void wallet::wallet_tests::PollutePubKey(CPubKey *pubkey)

{
  long lVar1;
  Span<const_unsigned_char> _vch;
  bool bVar2;
  uint uVar3;
  uchar *__n;
  iterator this;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_raw;
  CPubKey *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined2 in_stack_ffffffffffffff34;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 in_stack_ffffffffffffff37;
  CPubKey *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff50;
  const_iterator in_stack_ffffffffffffff78;
  undefined8 local_49;
  undefined8 uStack_41;
  undefined8 local_39;
  undefined8 uStack_31;
  undefined8 local_29;
  undefined8 uStack_21;
  undefined8 local_19;
  undefined8 uStack_11;
  undefined1 local_9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = CPubKey::size(in_stack_ffffffffffffff28);
  if (uVar3 == 0) {
    __assert_fail("pubkey.size() >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x218,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff28);
  __n = CPubKey::operator[](in_stack_ffffffffffffff38,
                            CONCAT13(in_stack_ffffffffffffff37,
                                     CONCAT12(in_stack_ffffffffffffff36,in_stack_ffffffffffffff34)))
  ;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_ffffffffffffff38,
             (value_type_conflict3 *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_ffffffffffffff38,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_ffffffffffffff37,
                         CONCAT16(in_stack_ffffffffffffff36,
                                  CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))));
  uVar3 = CPubKey::size(in_stack_ffffffffffffff28);
  this = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
                   (in_stack_ffffffffffffff50,in_stack_ffffffffffffff78,__n,
                    (value_type_conflict3 *)CONCAT44(uVar3,in_stack_ffffffffffffff40));
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((Span<const_unsigned_char> *)this._M_current,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff37,
                      CONCAT16(in_stack_ffffffffffffff36,
                               CONCAT24(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30))),
             in_stack_ffffffffffffff28);
  _vch.m_data._4_4_ = uVar3;
  _vch.m_data._0_4_ = in_stack_ffffffffffffff40;
  _vch.m_size = (size_t)__n;
  CPubKey::CPubKey((CPubKey *)this._M_current,_vch);
  *(undefined1 *)(in_RDI + 8) = local_9;
  in_RDI[6] = local_19;
  in_RDI[7] = uStack_11;
  in_RDI[4] = local_29;
  in_RDI[5] = uStack_21;
  in_RDI[2] = local_39;
  in_RDI[3] = uStack_31;
  *in_RDI = local_49;
  in_RDI[1] = uStack_41;
  bVar2 = CPubKey::IsFullyValid((CPubKey *)CONCAT44(uVar3,in_stack_ffffffffffffff40));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!pubkey.IsFullyValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x21d,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
  }
  bVar2 = CPubKey::IsValid(in_stack_ffffffffffffff28);
  if (!bVar2) {
    __assert_fail("pubkey.IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x21e,"void wallet::wallet_tests::PollutePubKey(CPubKey &)");
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this._M_current);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void PollutePubKey(CPubKey& pubkey)
{
    assert(pubkey.size() >= 1);
    std::vector<unsigned char> pubkey_raw;
    pubkey_raw.push_back(pubkey[0]);
    pubkey_raw.insert(pubkey_raw.end(), pubkey.size() - 1, 0);
    pubkey = CPubKey(pubkey_raw);
    assert(!pubkey.IsFullyValid());
    assert(pubkey.IsValid());
}